

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_rem_x86_64(float64 a,float64 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  float64 fVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
      a = a & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    if ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
      b = b & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
  }
  uVar13 = a & 0xfffffffffffff;
  uVar6 = (uint)(a >> 0x34) & 0x7ff;
  uVar12 = b & 0xfffffffffffff;
  uVar11 = (uint)(b >> 0x34) & 0x7ff;
  if (uVar6 == 0x7ff) {
    if ((uVar13 == 0) && (uVar12 == 0 || uVar11 != 0x7ff)) {
LAB_004e01f7:
      status->float_exception_flags = status->float_exception_flags | 1;
      return 0xfff8000000000000;
    }
LAB_004e0064:
    fVar5 = propagateFloat64NaN(a,b,status);
    return fVar5;
  }
  if (uVar11 == 0) {
    if (uVar12 == 0) goto LAB_004e01f7;
    lVar16 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    uVar11 = ((uint)lVar16 ^ 0x3f) + 0xf5;
    uVar12 = uVar12 << ((byte)uVar11 & 0x3f);
    uVar11 = 1 - (uVar11 & 0xff);
  }
  else if (uVar11 == 0x7ff) {
    if (uVar12 == 0) {
      return a;
    }
    goto LAB_004e0064;
  }
  if (uVar6 == 0) {
    if (uVar13 == 0) {
      return a;
    }
    lVar16 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    uVar6 = ((uint)lVar16 ^ 0x3f) + 0xf5;
    uVar13 = uVar13 << ((byte)uVar6 & 0x3f);
    uVar6 = 1 - (uVar6 & 0xff);
  }
  uVar14 = uVar13 << 0xb | 0x8000000000000000;
  uVar9 = uVar12 << 0xb;
  uVar13 = uVar9 | 0x8000000000000000;
  uVar6 = uVar6 - uVar11;
  if ((int)uVar6 < 0) {
    if (uVar6 != 0xffffffff) {
      return a;
    }
    uVar15 = uVar14 >> 1;
    uVar14 = 0;
LAB_004e0337:
    uVar15 = uVar15 >> 2;
  }
  else {
    uVar15 = 0;
    if (uVar13 <= uVar14) {
      uVar15 = uVar13;
    }
    uVar15 = uVar14 - uVar15;
    iVar17 = uVar6 - 0x40;
    if (uVar6 < 0x41) {
      uVar14 = (ulong)(uVar13 <= uVar14);
    }
    else {
      uVar18 = uVar13 >> 0x20;
      uVar10 = uVar9 & 0xffffffff00000000 | 0x8000000000000000;
      iVar19 = iVar17;
      do {
        uVar7 = 0xffffffffffffffff;
        if (uVar15 < uVar13) {
          uVar14 = 0xffffffff00000000;
          if (uVar15 < uVar10) {
            uVar14 = uVar15 / uVar18 << 0x20;
          }
          uVar8 = (uVar14 >> 0x20) * (uVar9 & 0xffffffff);
          uVar20 = uVar14 * uVar13;
          uVar7 = -uVar20;
          for (lVar16 = ((uVar15 - ((uVar8 >> 0x20) + uVar18 * (uVar14 >> 0x20))) -
                        (ulong)(uVar20 != 0)) - (ulong)(uVar20 < uVar8 << 0x20); lVar16 < 0;
              lVar16 = lVar16 + uVar18 + (ulong)bVar21) {
            uVar14 = uVar14 - 0x100000000;
            bVar21 = CARRY8(uVar7,uVar12 << 0x2b);
            uVar7 = uVar7 + (uVar12 << 0x2b);
          }
          uVar15 = uVar7 >> 0x20 | lVar16 << 0x20;
          uVar7 = 0xffffffff;
          if (uVar15 < uVar10) {
            uVar7 = uVar15 / uVar18;
          }
          uVar7 = uVar7 | uVar14;
        }
        uVar14 = 0;
        if (1 < uVar7) {
          uVar14 = uVar7 - 2;
        }
        uVar15 = -((uVar13 >> 2) * uVar14);
        iVar17 = iVar19 + -0x3e;
        bVar21 = 0x3e < iVar19;
        iVar19 = iVar17;
      } while (bVar21);
    }
    if (iVar17 < -0x3f) goto LAB_004e0337;
    uVar10 = 0xffffffffffffffff;
    if (uVar15 < uVar13) {
      uVar7 = uVar13 >> 0x20;
      uVar18 = uVar9 & 0xffffffff00000000 | 0x8000000000000000;
      uVar14 = 0xffffffff00000000;
      if (uVar15 < uVar18) {
        uVar14 = uVar15 / uVar7 << 0x20;
      }
      uVar8 = (uVar9 & 0xffffffff) * (uVar14 >> 0x20);
      uVar10 = uVar14 * uVar13;
      uVar9 = -uVar10;
      lVar16 = ((uVar15 - ((uVar8 >> 0x20) + (uVar14 >> 0x20) * uVar7)) - (ulong)(uVar10 != 0)) -
               (ulong)(uVar10 < uVar8 << 0x20);
      if (lVar16 < 0) {
        do {
          uVar14 = uVar14 - 0x100000000;
          bVar21 = CARRY8(uVar9,uVar12 << 0x2b);
          uVar9 = uVar9 + (uVar12 << 0x2b);
          lVar16 = lVar16 + uVar7 + (ulong)bVar21;
        } while (lVar16 < 0);
      }
      uVar12 = uVar9 >> 0x20 | lVar16 << 0x20;
      uVar10 = 0xffffffff;
      if (uVar12 < uVar18) {
        uVar10 = uVar12 / uVar7;
      }
      uVar10 = uVar10 | uVar14;
    }
    uVar14 = 0;
    if (1 < uVar10) {
      uVar14 = uVar10 - 2;
    }
    uVar14 = uVar14 >> (-(char)iVar17 & 0x3fU);
    uVar15 = ((uVar15 >> 1) << ((char)iVar17 + 0x3fU & 0x3f)) - uVar14 * (uVar13 >> 2);
  }
  uVar13 = uVar13 >> 2;
  uVar12 = 0xffffffffffffffff;
  if ((long)(uVar15 - uVar13) < -1) {
    uVar12 = uVar15 - uVar13;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar13;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ~uVar12 + uVar15;
  uVar12 = SUB168(auVar2 / auVar1,0);
  uVar9 = uVar15 - uVar13 * uVar12;
  uVar15 = ~uVar12 * uVar13 + uVar15;
  lVar16 = uVar15 + uVar9;
  if ((lVar16 < 0) ||
     (bVar3 = 1, lVar16 == 0 && ((int)uVar14 + SUB164(auVar2 / auVar1,0) & 1U) == 0)) {
    bVar3 = (byte)(uVar9 >> 0x38);
    bVar4 = bVar3 >> 7;
    uVar15 = uVar9;
    bVar3 = bVar3 >> 7;
    if (-1 < (long)uVar9) goto LAB_004e03ab;
  }
  bVar4 = bVar3;
  uVar9 = -uVar15;
LAB_004e03ab:
  if (uVar9 == 0) {
    uVar6 = 0x40;
  }
  else {
    lVar16 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    uVar6 = (uint)lVar16 ^ 0x3f;
  }
  fVar5 = roundAndPackFloat64(bVar4 ^ (byte)(a >> 0x3f),uVar11 - (uVar6 - 1),
                              uVar9 << ((byte)(uVar6 - 1) & 0x3f),status);
  return fVar5;
}

Assistant:

float64 float64_rem(float64 a, float64 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint64_t aSig, bSig;
    uint64_t q, alternateASig;
    int64_t sigMean;

    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    bSig = extractFloat64Frac( b );
    bExp = extractFloat64Exp( b );
    if ( aExp == 0x7FF ) {
        if ( aSig || ( ( bExp == 0x7FF ) && bSig ) ) {
            return propagateFloat64NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( bExp == 0x7FF ) {
        if (bSig) {
            return propagateFloat64NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float64_default_nan(status);
        }
        normalizeFloat64Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig = (aSig | UINT64_C(0x0010000000000000)) << 11;
    bSig = (bSig | UINT64_C(0x0010000000000000)) << 11;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        aSig >>= 1;
    }
    q = ( bSig <= aSig );
    if ( q ) aSig -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
#ifdef _MSC_VER
        aSig = 0ULL - ( ( bSig>>2 ) * q );
#else
        aSig = - ( ( bSig>>2 ) * q );
#endif
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        bSig >>= 2;
        aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
    }
    else {
        aSig >>= 2;
        bSig >>= 2;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int64_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int64_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0 - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat64(aSign ^ zSign, bExp, aSig, status);

}